

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frontend_tester.cpp
# Opt level: O0

FailStep failStepFromString(string *str)

{
  bool bVar1;
  runtime_error *this;
  string *str_local;
  
  bVar1 = std::operator==(str,"none");
  if (bVar1) {
    str_local._4_4_ = None;
  }
  else {
    bVar1 = std::operator==(str,"parsing");
    if (bVar1) {
      str_local._4_4_ = Parsing;
    }
    else {
      bVar1 = std::operator==(str,"semantic_analysis");
      if (!bVar1) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Unknown fail step provided");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      str_local._4_4_ = SemanticAnalysis;
    }
  }
  return str_local._4_4_;
}

Assistant:

FailStep failStepFromString(const std::string & str) {
  if (str == "none") {
    return FailStep::None;
  }

  if (str == "parsing") {
    return FailStep::Parsing;
  }

  if (str == "semantic_analysis") {
    return FailStep::SemanticAnalysis;
  }

  throw std::runtime_error("Unknown fail step provided");
}